

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O1

UBool icu_63::calcNameSetsLengths(UErrorCode *pErrorCode)

{
  ushort uVar1;
  bool bVar2;
  uint *puVar3;
  int8_t *tokenLengths;
  UBool UVar4;
  uint8_t *puVar5;
  byte bVar6;
  uint uVar7;
  int32_t i;
  long lVar8;
  int iVar9;
  uint8_t **pLine;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  byte *pbVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint16_t *tokens;
  uint8_t *tokenStrings;
  uint8_t *line;
  uint16_t lengths [34];
  uint16_t offsets [34];
  uint8_t *in_stack_fffffffffffffee8;
  uint8_t **local_108;
  ulong local_100;
  uint16_t *local_f8;
  int8_t *local_f0;
  uint *local_e8;
  long local_e0;
  ulong local_d8;
  uint8_t *local_d0;
  uint16_t local_c8 [40];
  uint16_t local_78 [36];
  ulong uVar10;
  
  if (gMaxNameLength == 0) {
    UVar4 = isDataLoaded(pErrorCode);
    if (UVar4 == '\0') {
      UVar4 = '\0';
    }
    else {
      lVar8 = 0;
      do {
        *(uint *)(gNameSet + (ulong)((byte)"0123456789ABCDEF<>-"[lVar8] >> 5) * 4) =
             *(uint *)(gNameSet + (ulong)((byte)"0123456789ABCDEF<>-"[lVar8] >> 5) * 4) |
             1 << ("0123456789ABCDEF<>-"[lVar8] & 0x1fU);
        puVar3 = uCharNames;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x13);
      iVar11 = *(int *)((long)uCharNames + (ulong)uCharNames[3]);
      if (iVar11 == 0) {
        uVar18 = 0;
      }
      else {
        lVar8 = (long)uCharNames + (ulong)uCharNames[3] + 4;
        uVar18 = 0;
        do {
          if (*(char *)(lVar8 + 8) == '\x01') {
            uVar13 = (ulong)*(byte *)(lVar8 + 9);
            bVar6 = *(byte *)(lVar8 + 0xc + uVar13 * 2);
            if (bVar6 == 0) {
              uVar14 = 0;
            }
            else {
              uVar14 = 0;
              do {
                *(uint *)(gNameSet + (bVar6 >> 3 & 0x1c)) =
                     *(uint *)(gNameSet + (bVar6 >> 3 & 0x1c)) | 1 << (bVar6 & 0x1f);
                bVar6 = *(byte *)(lVar8 + uVar13 * 2 + 0xd + uVar14);
                uVar14 = uVar14 + 1;
              } while (bVar6 != 0);
            }
            if (uVar13 != 0) {
              pbVar15 = (byte *)((long)(int)uVar14 + lVar8 + uVar13 * 2 + 0xd);
              uVar16 = 0;
              do {
                uVar1 = *(ushort *)(lVar8 + 0xc + uVar16 * 2);
                uVar10 = 0;
                iVar9 = 0;
                uVar7 = (uint)uVar1;
                if (uVar1 != 0) {
                  do {
                    bVar6 = *pbVar15;
                    uVar17 = 0;
                    if (bVar6 != 0) {
                      uVar17 = 0;
                      do {
                        *(uint *)(gNameSet + (bVar6 >> 3 & 0x1c)) =
                             *(uint *)(gNameSet + (bVar6 >> 3 & 0x1c)) | 1 << (bVar6 & 0x1f);
                        bVar6 = pbVar15[uVar17 + 1];
                        uVar17 = uVar17 + 1;
                      } while (bVar6 != 0);
                    }
                    if ((int)uVar10 < (int)uVar17) {
                      uVar10 = uVar17 & 0xffffffff;
                    }
                    iVar9 = (int)uVar10;
                    pbVar15 = pbVar15 + (long)(int)uVar17 + 1;
                    bVar2 = 1 < (int)uVar7;
                    uVar7 = uVar7 - 1;
                  } while (bVar2);
                }
                uVar14 = (ulong)(uint)((int)uVar14 + iVar9);
                uVar16 = uVar16 + 1;
              } while (uVar16 != uVar13);
            }
            if ((int)uVar18 < (int)uVar14) {
              uVar18 = uVar14 & 0xffffffff;
            }
          }
          else if (*(char *)(lVar8 + 8) == '\0') {
            lVar12 = 0;
            bVar6 = *(byte *)(lVar8 + 0xc);
            while (bVar6 != 0) {
              *(uint *)(gNameSet + (bVar6 >> 3 & 0x1c)) =
                   *(uint *)(gNameSet + (bVar6 >> 3 & 0x1c)) | 1 << (bVar6 & 0x1f);
              pbVar15 = (byte *)(lVar8 + 0xd + lVar12);
              lVar12 = lVar12 + 1;
              bVar6 = *pbVar15;
            }
            uVar7 = (uint)*(byte *)(lVar8 + 9) + (int)lVar12;
            if ((int)uVar18 < (int)uVar7) {
              uVar18 = (ulong)uVar7;
            }
          }
          lVar8 = lVar8 + (ulong)*(ushort *)(lVar8 + 10);
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      lVar8 = 0;
      do {
        pbVar15 = (&charCatNames)[lVar8];
        bVar6 = *pbVar15;
        if (bVar6 == 0) {
          uVar7 = 9;
        }
        else {
          lVar12 = 1;
          do {
            *(uint *)(gNameSet + (bVar6 >> 3 & 0x1c)) =
                 *(uint *)(gNameSet + (bVar6 >> 3 & 0x1c)) | 1 << (bVar6 & 0x1f);
            bVar6 = pbVar15[lVar12];
            lVar12 = lVar12 + 1;
          } while (bVar6 != 0);
          uVar7 = (int)lVar12 + 8;
        }
        if ((int)uVar18 < (int)uVar7) {
          uVar18 = (ulong)uVar7;
        }
        iVar11 = (int)uVar18;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x21);
      uVar13 = (ulong)(ushort)puVar3[4];
      uVar7 = *puVar3;
      local_f0 = (int8_t *)uprv_malloc_63(uVar13);
      if (local_f0 != (int8_t *)0x0) {
        memset(local_f0,0,uVar13);
      }
      uVar1 = *(ushort *)((long)uCharNames + (ulong)uCharNames[1]);
      local_100 = (ulong)uVar1;
      if (uVar1 != 0) {
        tokens = (uint16_t *)((long)puVar3 + 0x12);
        tokenStrings = (uint8_t *)((ulong)uVar7 + (long)puVar3);
        lVar8 = (long)uCharNames + (ulong)uCharNames[1] + 2;
        local_e8 = uCharNames;
        local_f8 = tokens;
        local_d8 = uVar13;
        local_d0 = tokenStrings;
        do {
          local_e0 = lVar8;
          puVar5 = expandGroupLengths((uint8_t *)
                                      ((long)local_e8 +
                                      ((long)(int)((uint)*(ushort *)(lVar8 + 2) << 0x10) |
                                      (ulong)*(ushort *)(lVar8 + 4)) + (ulong)local_e8[2]),local_78,
                                      local_c8);
          lVar8 = 0;
          do {
            tokenLengths = local_f0;
            local_108 = (uint8_t **)(puVar5 + local_78[lVar8]);
            if ((ulong)local_c8[lVar8] != 0) {
              pLine = (uint8_t **)((long)local_108 + (ulong)local_c8[lVar8]);
              uVar7 = calcNameSetLength(tokens,(uint16_t)uVar13,tokenStrings,local_f0,
                                        (uint32_t *)&local_108,pLine,in_stack_fffffffffffffee8);
              tokens = local_f8;
              if ((int)uVar18 < (int)uVar7) {
                uVar18 = (ulong)uVar7;
              }
              if ((local_108 != pLine) &&
                 (uVar7 = calcNameSetLength(local_f8,(uint16_t)uVar13,tokenStrings,tokenLengths,
                                            (uint32_t *)&local_108,pLine,in_stack_fffffffffffffee8),
                 uVar13 = local_d8, (int)uVar18 < (int)uVar7)) {
                uVar18 = (ulong)uVar7;
              }
            }
            iVar11 = (int)uVar18;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0x20);
          lVar8 = local_e0 + 6;
          iVar9 = (int)local_100;
          local_100 = (ulong)(iVar9 - 1);
        } while (1 < iVar9);
      }
      if (local_f0 != (int8_t *)0x0) {
        uprv_free_63(local_f0);
      }
      UVar4 = '\x01';
      gMaxNameLength = iVar11;
    }
    return UVar4;
  }
  return '\x01';
}

Assistant:

static UBool
calcNameSetsLengths(UErrorCode *pErrorCode) {
    static const char extChars[]="0123456789ABCDEF<>-";
    int32_t i, maxNameLength;

    if(gMaxNameLength!=0) {
        return TRUE;
    }

    if(!isDataLoaded(pErrorCode)) {
        return FALSE;
    }

    /* set hex digits, used in various names, and <>-, used in extended names */
    for(i=0; i<(int32_t)sizeof(extChars)-1; ++i) {
        SET_ADD(gNameSet, extChars[i]);
    }

    /* set sets and lengths from algorithmic names */
    maxNameLength=calcAlgNameSetsLengths(0);

    /* set sets and lengths from extended names */
    maxNameLength=calcExtNameSetsLengths(maxNameLength);

    /* set sets and lengths from group names, set global maximum values */
    calcGroupNameSetsLengths(maxNameLength);

    return TRUE;
}